

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopDescriptor::PostModificationCleanup(LoopDescriptor *this)

{
  pointer ppLVar1;
  pointer ppVar2;
  Loop *this_00;
  pointer ppLVar3;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  __position;
  LoopContainerType *__range2;
  pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>
  *pair;
  pointer ppVar4;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> _Var5;
  pointer ppLVar6;
  __node_base *p_Var7;
  Loop *loop;
  LoopContainerType loops_to_remove_;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_60;
  LoopsToAddContainerType *local_58;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_50;
  _Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppLVar1 = (this->loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar6 = (this->loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppLVar3 = local_48._M_impl.super__Vector_impl_data._M_finish, ppLVar6 != ppLVar1;
      ppLVar6 = ppLVar6 + 1) {
    local_60._M_head_impl = *ppLVar6;
    if ((local_60._M_head_impl)->loop_is_marked_for_removal_ == true) {
      std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&local_48,
                 &local_60._M_head_impl);
      if ((local_60._M_head_impl)->parent_ != (Loop *)0x0) {
        Loop::RemoveChildLoop((local_60._M_head_impl)->parent_,local_60._M_head_impl);
      }
    }
  }
  for (ppLVar6 = local_48._M_impl.super__Vector_impl_data._M_start; ppLVar6 != ppLVar3;
      ppLVar6 = ppLVar6 + 1) {
    local_60._M_head_impl = *ppLVar6;
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                           ((this->loops_).
                            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->loops_).
                            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_60);
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::erase
              (&this->loops_,(const_iterator)__position._M_current);
    _Var5._M_head_impl = local_60._M_head_impl;
    if (local_60._M_head_impl != (Loop *)0x0) {
      Loop::~Loop(local_60._M_head_impl);
    }
    operator_delete(_Var5._M_head_impl,0x90);
  }
  local_58 = &this->loops_to_add_;
  ppVar2 = (this->loops_to_add_).
           super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->loops_to_add_).
                super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    this_00 = ppVar4->first;
    local_60._M_head_impl =
         (ppVar4->second)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
         super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl;
    (ppVar4->second)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
    super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl = (Loop *)0x0;
    _Var5._M_head_impl = local_60._M_head_impl;
    if (this_00 != (Loop *)0x0) {
      (local_60._M_head_impl)->parent_ = (Loop *)0x0;
      Loop::AddNestedLoop(this_00,local_60._M_head_impl);
      p_Var7 = &((local_60._M_head_impl)->loop_basic_blocks_)._M_h._M_before_begin;
      while (p_Var7 = p_Var7->_M_nxt, _Var5._M_head_impl = local_60._M_head_impl,
            p_Var7 != (__node_base *)0x0) {
        Loop::AddBasicBlock(this_00,(uint32_t)*(size_type *)(p_Var7 + 1));
      }
    }
    local_60._M_head_impl = (Loop *)0x0;
    local_50._M_head_impl = _Var5._M_head_impl;
    std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
    emplace_back<spvtools::opt::Loop*>
              ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)this,
               &local_50._M_head_impl);
    std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
              ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)
               &local_60);
  }
  std::
  vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ::clear(local_58);
  std::_Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void LoopDescriptor::PostModificationCleanup() {
  LoopContainerType loops_to_remove_;
  for (Loop* loop : loops_) {
    if (loop->IsMarkedForRemoval()) {
      loops_to_remove_.push_back(loop);
      if (loop->HasParent()) {
        loop->GetParent()->RemoveChildLoop(loop);
      }
    }
  }

  for (Loop* loop : loops_to_remove_) {
    loops_.erase(std::find(loops_.begin(), loops_.end(), loop));
    delete loop;
  }

  for (auto& pair : loops_to_add_) {
    Loop* parent = pair.first;
    std::unique_ptr<Loop> loop = std::move(pair.second);

    if (parent) {
      loop->SetParent(nullptr);
      parent->AddNestedLoop(loop.get());

      for (uint32_t block_id : loop->GetBlocks()) {
        parent->AddBasicBlock(block_id);
      }
    }

    loops_.emplace_back(loop.release());
  }

  loops_to_add_.clear();
}